

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O0

bool deqp::egl::anon_unknown_7::configListEqual
               (Library *egl,EGLDisplay *display,vector<void_*,_std::allocator<void_*>_> *as,
               vector<void_*,_std::allocator<void_*>_> *bs)

{
  value_type pvVar1;
  EGLDisplay pvVar2;
  EGLint EVar3;
  EGLint EVar4;
  size_type sVar5;
  size_type sVar6;
  const_reference ppvVar7;
  EGLint bCaveat;
  EGLint aCaveat;
  int configNdx;
  vector<void_*,_std::allocator<void_*>_> *bs_local;
  vector<void_*,_std::allocator<void_*>_> *as_local;
  EGLDisplay *display_local;
  Library *egl_local;
  
  sVar5 = std::vector<void_*,_std::allocator<void_*>_>::size(as);
  sVar6 = std::vector<void_*,_std::allocator<void_*>_>::size(bs);
  if (sVar5 == sVar6) {
    for (bCaveat = 0; sVar5 = std::vector<void_*,_std::allocator<void_*>_>::size(as),
        bCaveat < (int)sVar5; bCaveat = bCaveat + 1) {
      ppvVar7 = std::vector<void_*,_std::allocator<void_*>_>::operator[](as,(long)bCaveat);
      pvVar1 = *ppvVar7;
      ppvVar7 = std::vector<void_*,_std::allocator<void_*>_>::operator[](bs,(long)bCaveat);
      if (pvVar1 != *ppvVar7) {
        pvVar2 = *display;
        ppvVar7 = std::vector<void_*,_std::allocator<void_*>_>::operator[](as,(long)bCaveat);
        EVar3 = eglu::getConfigAttribInt(egl,pvVar2,*ppvVar7,0x3027);
        pvVar2 = *display;
        ppvVar7 = std::vector<void_*,_std::allocator<void_*>_>::operator[](bs,(long)bCaveat);
        EVar4 = eglu::getConfigAttribInt(egl,pvVar2,*ppvVar7,0x3027);
        if ((EVar3 != 0x3051) || (EVar4 != 0x3051)) {
          return false;
        }
      }
    }
    egl_local._7_1_ = true;
  }
  else {
    egl_local._7_1_ = false;
  }
  return egl_local._7_1_;
}

Assistant:

bool configListEqual (const Library& egl, const EGLDisplay& display, const vector<EGLConfig>& as, const vector<EGLConfig>& bs)
{
	if (as.size() != bs.size())
		return false;

	for (int configNdx = 0; configNdx < (int)as.size(); configNdx++)
	{
		if (as[configNdx] != bs[configNdx])
		{
			// Allow lists to differ if both configs are non-conformant
			const EGLint aCaveat = eglu::getConfigAttribInt(egl, display, as[configNdx], EGL_CONFIG_CAVEAT);
			const EGLint bCaveat = eglu::getConfigAttribInt(egl, display, bs[configNdx], EGL_CONFIG_CAVEAT);

			if (aCaveat != EGL_NON_CONFORMANT_CONFIG || bCaveat != EGL_NON_CONFORMANT_CONFIG)
				return false;
		}
	}

	return true;
}